

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.h
# Opt level: O0

S2Point * __thiscall S2Loop::oriented_vertex(S2Loop *this,int i)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int local_58;
  int j;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  S2Loop *pSStack_10;
  int i_local;
  S2Loop *this_local;
  
  local_29 = 0;
  local_14 = i;
  pSStack_10 = this;
  if (i < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xbf,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar4 = S2LogMessage::stream(&local_28);
    poVar4 = std::operator<<(poVar4,"Check failed: (i) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar4);
  }
  iVar3 = local_14;
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  iVar2 = num_vertices(this);
  local_58 = local_14;
  if (SBORROW4(iVar3,iVar2 * 2) == iVar3 + iVar2 * -2 < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&j,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xc0,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream((S2LogMessage *)&j);
    poVar4 = std::operator<<(poVar4,"Check failed: (i) < (2 * num_vertices()) ");
    S2LogMessageVoidify::operator&(local_3d,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&j);
  }
  iVar3 = num_vertices(this);
  local_58 = local_58 - iVar3;
  if (local_58 < 0) {
    local_58 = local_14;
  }
  bVar1 = is_hole(this);
  if (bVar1) {
    iVar3 = num_vertices(this);
    local_58 = (iVar3 + -1) - local_58;
  }
  return this->vertices_ + local_58;
}

Assistant:

const S2Point& oriented_vertex(int i) const {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * num_vertices());
    int j = i - num_vertices();
    if (j < 0) j = i;
    if (is_hole()) j = num_vertices() - 1 - j;
    return vertices_[j];
  }